

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O1

QString * __thiscall QTemporaryDir::errorString(QString *__return_storage_ptr__,QTemporaryDir *this)

{
  QTemporaryDirPrivate *pQVar1;
  Data *pDVar2;
  
  pQVar1 = this->d_ptr;
  if (pQVar1->success == true) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  pDVar2 = (pQVar1->pathOrError).d.d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = (pQVar1->pathOrError).d.ptr;
  (__return_storage_ptr__->d).size = (pQVar1->pathOrError).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTemporaryDir::errorString() const
{
    return d_ptr->success ? QString() : d_ptr->pathOrError;
}